

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall rsg::VariableManager::declareVariable(VariableManager *this,Variable *variable)

{
  bool bVar1;
  reference ppVVar2;
  VariableScope *this_00;
  ValueScope *scope;
  __normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>
  local_60;
  __normal_iterator<rsg::ValueScope_*const_*,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>
  local_58;
  const_iterator stackIter;
  const_iterator local_48;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_40;
  CompareEntryVariable local_38;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_30;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_28;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_20;
  iterator pos;
  Variable *variable_local;
  VariableManager *this_local;
  
  pos._M_current = (ValueEntry **)variable;
  local_28._M_current =
       (ValueEntry **)
       std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::begin
                 (&this->m_entryCache);
  local_30._M_current =
       (ValueEntry **)
       std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                 (&this->m_entryCache);
  CompareEntryVariable::CompareEntryVariable(&local_38,(Variable *)pos._M_current);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,rsg::CompareEntryVariable>
                       (local_28,local_30,&local_38);
  local_40._M_current =
       (ValueEntry **)
       std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                 (&this->m_entryCache);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<rsg::ValueEntry_const*const*,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>
    ::__normal_iterator<rsg::ValueEntry_const**>
              ((__normal_iterator<rsg::ValueEntry_const*const*,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>
                *)&local_48,&local_20);
    stackIter._M_current =
         (ValueScope **)
         std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::erase
                   (&this->m_entryCache,local_48);
  }
  local_60._M_current =
       (ValueScope **)
       std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>::begin
                 (&this->m_valueScopeStack);
  __gnu_cxx::
  __normal_iterator<rsg::ValueScope*const*,std::vector<rsg::ValueScope*,std::allocator<rsg::ValueScope*>>>
  ::__normal_iterator<rsg::ValueScope**>
            ((__normal_iterator<rsg::ValueScope*const*,std::vector<rsg::ValueScope*,std::allocator<rsg::ValueScope*>>>
              *)&local_58,&local_60);
  while( true ) {
    scope = (ValueScope *)
            std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>::end
                      (&this->m_valueScopeStack);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>
                        *)&scope);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<rsg::ValueScope_*const_*,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>
              ::operator*(&local_58);
    ValueScope::removeValue(*ppVVar2,(Variable *)pos._M_current);
    __gnu_cxx::
    __normal_iterator<rsg::ValueScope_*const_*,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>
    ::operator++(&local_58,0);
  }
  this_00 = getCurVariableScope(this);
  VariableScope::declare(this_00,(Variable *)pos._M_current);
  return;
}

Assistant:

void VariableManager::declareVariable (Variable* variable)
{
	// Remove from cache if exists in there.
	std::vector<const ValueEntry*>::iterator pos = std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));
	if (pos != m_entryCache.end())
		m_entryCache.erase(pos);

	DE_ASSERT(std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable)) == m_entryCache.end());

	// Remove from scope stack.
	for (vector<ValueScope*>::const_iterator stackIter = m_valueScopeStack.begin(); stackIter != m_valueScopeStack.end(); stackIter++)
	{
		ValueScope* scope = *stackIter;
		scope->removeValue(variable);
	}

	// Declare in current scope.
	getCurVariableScope().declare(variable);
}